

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O3

int compute_codewords(Codebook *c,uint8 *len,int n,uint32 *values)

{
  uint8 uVar1;
  uint uVar2;
  byte bVar3;
  uint uVar4;
  long lVar5;
  byte bVar6;
  int iVar7;
  uint uVar8;
  uint32 uVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  uint32 available [32];
  uint auStack_b8 [34];
  
  uVar10 = 0;
  SDL_memset(auStack_b8,0,0x80);
  if (n < 1) {
LAB_00124332:
    uVar9 = (uint32)uVar10;
    if (uVar9 != n) {
      uVar10 = uVar10 & 0xffffffff;
      if (c->sparse == '\0') {
        c->codewords[uVar10] = 0;
      }
      else {
        uVar1 = len[uVar10];
        *c->codewords = 0;
        *c->codeword_lengths = uVar1;
        *values = uVar9;
      }
      bVar3 = len[uVar10];
      if ((ulong)bVar3 != 0) {
        lVar5 = (ulong)bVar3 - 1;
        auVar11._8_4_ = (int)lVar5;
        auVar11._0_8_ = lVar5;
        auVar11._12_4_ = (int)((ulong)lVar5 >> 0x20);
        bVar6 = 0x1e;
        uVar10 = 0;
        auVar11 = auVar11 ^ _DAT_00126030;
        do {
          auVar12._8_4_ = (int)uVar10;
          auVar12._0_8_ = uVar10;
          auVar12._12_4_ = (int)(uVar10 >> 0x20);
          auVar12 = (auVar12 | _DAT_001266a0) ^ _DAT_00126030;
          if ((bool)(~(auVar12._4_4_ == auVar11._4_4_ && auVar11._0_4_ < auVar12._0_4_ ||
                      auVar11._4_4_ < auVar12._4_4_) & 1)) {
            auStack_b8[uVar10 + 1] = 0x80000000 >> ((byte)uVar10 & 0x1f);
          }
          if ((auVar12._12_4_ != auVar11._12_4_ || auVar12._8_4_ <= auVar11._8_4_) &&
              auVar12._12_4_ <= auVar11._12_4_) {
            auStack_b8[uVar10 + 2] = 1 << (bVar6 & 0x1f);
          }
          uVar10 = uVar10 + 2;
          bVar6 = bVar6 - 2;
        } while ((bVar3 + 1 & 0xfffffffe) != uVar10);
      }
      if ((int)(uVar9 + 1) < n) {
        uVar10 = (ulong)(uVar9 + 1);
        iVar7 = 1;
        do {
          bVar3 = len[uVar10];
          if (bVar3 != 0xff) {
            uVar8 = (uint)bVar3;
            if (bVar3 == 0) {
              return (uint)bVar3;
            }
            while( true ) {
              uVar2 = auStack_b8[uVar8];
              if (uVar2 != 0) break;
              uVar8 = uVar8 - 1;
              if (uVar8 == 0) {
                return 0;
              }
            }
            auStack_b8[uVar8] = 0;
            uVar4 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
            uVar4 = (uVar4 & 0xf0f0f0f) << 4 | uVar4 >> 4 & 0xf0f0f0f;
            uVar4 = (uVar4 >> 2 & 0x33333333) + (uVar4 & 0x33333333) * 4;
            uVar9 = (uVar4 >> 1 & 0x55555555) + (uVar4 & 0x55555555) * 2;
            if (c->sparse == '\0') {
              c->codewords[uVar10] = uVar9;
            }
            else {
              c->codewords[iVar7] = uVar9;
              c->codeword_lengths[iVar7] = bVar3;
              values[iVar7] = (uint32)uVar10;
            }
            iVar7 = iVar7 + 1;
            bVar3 = len[uVar10];
            uVar4 = (uint)bVar3;
            if ((int)uVar8 < (int)(uint)bVar3) {
              bVar3 = 0x20 - bVar3;
              do {
                auStack_b8[uVar4] = (1 << (bVar3 & 0x1f)) + uVar2;
                uVar4 = uVar4 - 1;
                bVar3 = bVar3 + 1;
              } while ((int)uVar8 < (int)uVar4);
            }
          }
          uVar10 = uVar10 + 1;
        } while ((int)uVar10 < n);
      }
    }
  }
  else {
    uVar10 = 0;
    do {
      if (len[uVar10] != 0xff) goto LAB_00124332;
      uVar10 = uVar10 + 1;
    } while ((uint)n != uVar10);
  }
  return 1;
}

Assistant:

static int compute_codewords(Codebook *c, uint8 *len, int n, uint32 *values)
{
   int i,k,m=0;
   uint32 available[32];

   memset(available, 0, sizeof(available));
   // find the first entry
   for (k=0; k < n; ++k) if (len[k] < NO_CODE) break;
   if (k == n) { assert(c->sorted_entries == 0); return TRUE; }
   // add to the list
   add_entry(c, 0, k, m++, len[k], values);
   // add all available leaves
   for (i=1; i <= len[k]; ++i)
      available[i] = 1U << (32-i);
   // note that the above code treats the first case specially,
   // but it's really the same as the following code, so they
   // could probably be combined (except the initial code is 0,
   // and I use 0 in available[] to mean 'empty')
   for (i=k+1; i < n; ++i) {
      uint32 res;
      int z = len[i], y;
      if (z == NO_CODE) continue;
      // find lowest available leaf (should always be earliest,
      // which is what the specification calls for)
      // note that this property, and the fact we can never have
      // more than one free leaf at a given level, isn't totally
      // trivial to prove, but it seems true and the assert never
      // fires, so!
      while (z > 0 && !available[z]) --z;
      if (z == 0) { return FALSE; }
      res = available[z];
      assert(z >= 0 && z < 32);
      available[z] = 0;
      add_entry(c, bit_reverse(res), i, m++, len[i], values);
      // propagate availability up the tree
      if (z != len[i]) {
         assert(len[i] >= 0 && len[i] < 32);
         for (y=len[i]; y > z; --y) {
            assert(available[y] == 0);
            available[y] = res + (1 << (32-y));
         }
      }
   }
   return TRUE;
}